

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl::WriteAllToZip
          (GeneratorContextImpl *this,string *filename)

{
  pointer *this_00;
  int iVar1;
  char *pcVar2;
  int *piVar3;
  ostream *poVar4;
  pointer filename_00;
  pointer ppVar5;
  bool bVar6;
  iterator local_c8;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  local_c0;
  iterator local_b8;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  local_b0;
  const_iterator iter;
  undefined1 local_98 [8];
  ZipWriter zip_writer;
  FileOutputStream stream;
  int error;
  int file_descriptor;
  string *filename_local;
  GeneratorContextImpl *this_local;
  
  if ((this->had_error_ & 1U) == 0) {
    do {
      pcVar2 = (char *)std::__cxx11::string::c_str();
      iVar1 = open(pcVar2,0x241,0x1b6);
      bVar6 = false;
      if (iVar1 < 0) {
        piVar3 = __errno_location();
        bVar6 = *piVar3 == 4;
      }
    } while (bVar6);
    if (iVar1 < 0) {
      piVar3 = __errno_location();
      iVar1 = *piVar3;
      poVar4 = std::operator<<((ostream *)&std::cerr,(string *)filename);
      poVar4 = std::operator<<(poVar4,": ");
      pcVar2 = strerror(iVar1);
      std::operator<<(poVar4,pcVar2);
      this_local._7_1_ = false;
    }
    else {
      this_00 = &zip_writer.files_.
                 super__Vector_base<google::protobuf::compiler::ZipWriter::FileInfo,_std::allocator<google::protobuf::compiler::ZipWriter::FileInfo>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      io::FileOutputStream::FileOutputStream((FileOutputStream *)this_00,iVar1,-1);
      ZipWriter::ZipWriter((ZipWriter *)local_98,(ZeroCopyOutputStream *)this_00);
      local_b8._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
           ::begin(&this->files_);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
      ::_Rb_tree_const_iterator(&local_b0,&local_b8);
      while( true ) {
        local_c8._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
             ::end(&this->files_);
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
        ::_Rb_tree_const_iterator(&local_c0,&local_c8);
        bVar6 = std::operator!=(&local_b0,&local_c0);
        if (!bVar6) break;
        filename_00 = std::
                      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                      ::operator->(&local_b0);
        ppVar5 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                 ::operator->(&local_b0);
        ZipWriter::Write((ZipWriter *)local_98,&filename_00->first,ppVar5->second);
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
        ::operator++(&local_b0);
      }
      ZipWriter::WriteDirectory((ZipWriter *)local_98);
      iVar1 = io::FileOutputStream::GetErrno
                        ((FileOutputStream *)
                         &zip_writer.files_.
                          super__Vector_base<google::protobuf::compiler::ZipWriter::FileInfo,_std::allocator<google::protobuf::compiler::ZipWriter::FileInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (iVar1 != 0) {
        poVar4 = std::operator<<((ostream *)&std::cerr,(string *)filename);
        poVar4 = std::operator<<(poVar4,": ");
        iVar1 = io::FileOutputStream::GetErrno
                          ((FileOutputStream *)
                           &zip_writer.files_.
                            super__Vector_base<google::protobuf::compiler::ZipWriter::FileInfo,_std::allocator<google::protobuf::compiler::ZipWriter::FileInfo>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pcVar2 = strerror(iVar1);
        poVar4 = std::operator<<(poVar4,pcVar2);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      }
      bVar6 = io::FileOutputStream::Close
                        ((FileOutputStream *)
                         &zip_writer.files_.
                          super__Vector_base<google::protobuf::compiler::ZipWriter::FileInfo,_std::allocator<google::protobuf::compiler::ZipWriter::FileInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (!bVar6) {
        poVar4 = std::operator<<((ostream *)&std::cerr,(string *)filename);
        poVar4 = std::operator<<(poVar4,": ");
        iVar1 = io::FileOutputStream::GetErrno
                          ((FileOutputStream *)
                           &zip_writer.files_.
                            super__Vector_base<google::protobuf::compiler::ZipWriter::FileInfo,_std::allocator<google::protobuf::compiler::ZipWriter::FileInfo>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pcVar2 = strerror(iVar1);
        poVar4 = std::operator<<(poVar4,pcVar2);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      }
      this_local._7_1_ = true;
      ZipWriter::~ZipWriter((ZipWriter *)local_98);
      io::FileOutputStream::~FileOutputStream
                ((FileOutputStream *)
                 &zip_writer.files_.
                  super__Vector_base<google::protobuf::compiler::ZipWriter::FileInfo,_std::allocator<google::protobuf::compiler::ZipWriter::FileInfo>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool CommandLineInterface::GeneratorContextImpl::WriteAllToZip(
    const string& filename) {
  if (had_error_) {
    return false;
  }

  // Create the output file.
  int file_descriptor;
  do {
    file_descriptor =
      open(filename.c_str(), O_WRONLY | O_CREAT | O_TRUNC | O_BINARY, 0666);
  } while (file_descriptor < 0 && errno == EINTR);

  if (file_descriptor < 0) {
    int error = errno;
    std::cerr << filename << ": " << strerror(error);
    return false;
  }

  // Create the ZipWriter
  io::FileOutputStream stream(file_descriptor);
  ZipWriter zip_writer(&stream);

  for (std::map<string, string*>::const_iterator iter = files_.begin();
       iter != files_.end(); ++iter) {
    zip_writer.Write(iter->first, *iter->second);
  }

  zip_writer.WriteDirectory();

  if (stream.GetErrno() != 0) {
    std::cerr << filename << ": " << strerror(stream.GetErrno()) << std::endl;
  }

  if (!stream.Close()) {
    std::cerr << filename << ": " << strerror(stream.GetErrno()) << std::endl;
  }

  return true;
}